

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O1

void __thiscall
glcts::ArraysOfArrays::
ConstructorsAndUnsizedDeclUnsizedConstructors<glcts::ArraysOfArrays::Interface::ES>::
test_shader_compilation
          (ConstructorsAndUnsizedDeclUnsizedConstructors<glcts::ArraysOfArrays::Interface::ES> *this
          ,TestShaderType tested_shader_type)

{
  long *plVar1;
  ulong *puVar2;
  TestError *pTVar3;
  long *plVar4;
  undefined1 *puVar5;
  long lVar6;
  undefined1 *puVar7;
  long *plVar8;
  string shader_source;
  string shader_variable_declarations;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string input [15];
  long *local_2a0;
  long local_298;
  long local_290;
  long lStack_288;
  long *local_280 [2];
  long local_270 [2];
  long *local_260 [2];
  long local_250 [2];
  long *local_240;
  long local_238;
  long local_230;
  long lStack_228;
  ConstructorsAndUnsizedDeclUnsizedConstructors<glcts::ArraysOfArrays::Interface::ES> *local_220;
  undefined1 *local_218 [2];
  undefined1 local_208 [16];
  undefined1 *local_1f8 [2];
  undefined1 local_1e8 [16];
  undefined1 *local_1d8 [2];
  undefined1 local_1c8 [16];
  undefined1 *local_1b8 [2];
  undefined1 local_1a8 [16];
  undefined1 *local_198 [2];
  undefined1 local_188 [16];
  undefined1 *local_178 [2];
  undefined1 local_168 [16];
  undefined1 *local_158 [2];
  undefined1 local_148 [16];
  undefined1 *local_138 [2];
  undefined1 local_128 [16];
  undefined1 *local_118 [2];
  undefined1 local_108 [16];
  undefined1 *local_f8 [2];
  undefined1 local_e8 [16];
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  long *local_58 [2];
  long local_48 [3];
  
  local_280[0] = local_270;
  local_220 = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_280,
             "= float[2][1][2][1](\n        float[1][2][1](\n            float[2][1]( \n                float[1](12.3), float[1](54.2) \n            )\n        ),\n        float[1][2][1](\n            float[2][1]( \n                float[1]( 3.2), float[1]( 7.4) \n            )\n        )\n    );\n\n"
             ,"");
  local_218[0] = local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"float a[2][1][2][]","");
  local_1f8[0] = local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"float a[2][1][][1]","");
  local_1d8[0] = local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"float a[2][1][][]","");
  local_1b8[0] = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"float a[2][][2][1]","");
  local_198[0] = local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"float a[2][][2][]","");
  local_178[0] = local_168;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"float a[2][][][1]","");
  local_158[0] = local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"float a[2][][][]","");
  local_138[0] = local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"float a[][1][2][1]","");
  local_118[0] = local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"float a[][1][2][]","");
  local_f8[0] = local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"float a[][1][][1]","");
  local_d8[0] = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"float a[][1][][]","");
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"float a[][][2][1]","");
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"float a[][][2][]","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"float a[][][][1]","");
  plVar8 = local_48;
  local_58[0] = plVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"float a[][][][]","");
  lVar6 = 8;
  do {
    local_260[0] = local_250;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_260,shader_start_abi_cxx11_,DAT_02233658 + shader_start_abi_cxx11_);
    std::__cxx11::string::append((char *)local_260);
    plVar1 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_260,*(ulong *)((long)local_218 + lVar6 + -8));
    plVar4 = plVar1 + 2;
    if ((long *)*plVar1 == plVar4) {
      local_230 = *plVar4;
      lStack_228 = plVar1[3];
      local_240 = &local_230;
    }
    else {
      local_230 = *plVar4;
      local_240 = (long *)*plVar1;
    }
    local_238 = plVar1[1];
    *plVar1 = (long)plVar4;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    plVar1 = (long *)std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_280[0]);
    plVar4 = plVar1 + 2;
    if ((long *)*plVar1 == plVar4) {
      local_290 = *plVar4;
      lStack_288 = plVar1[3];
      local_2a0 = &local_290;
    }
    else {
      local_290 = *plVar4;
      local_2a0 = (long *)*plVar1;
    }
    local_298 = plVar1[1];
    *plVar1 = (long)plVar4;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    if (local_240 != &local_230) {
      operator_delete(local_240,local_230 + 1);
    }
    if (local_260[0] != local_250) {
      operator_delete(local_260[0],local_250[0] + 1);
    }
    if (TESSELATION_EVALUATION_SHADER_TYPE < tested_shader_type) {
      pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar3,"Unrecognized shader type.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x847);
      __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    puVar2 = &set_tesseation_abi_cxx11_;
    switch(tested_shader_type) {
    case VERTEX_SHADER_TYPE:
      std::__cxx11::string::append((char *)&local_2a0);
      break;
    case GEOMETRY_SHADER_TYPE:
      puVar2 = &emit_quad_abi_cxx11_;
    case TESSELATION_CONTROL_SHADER_TYPE:
      std::__cxx11::string::_M_append((char *)&local_2a0,*puVar2);
    }
    std::__cxx11::string::_M_append((char *)&local_2a0,shader_end_abi_cxx11_);
    puVar5 = empty_string_abi_cxx11_;
    puVar7 = empty_string_abi_cxx11_;
    switch(tested_shader_type) {
    case FRAGMENT_SHADER_TYPE:
      puVar7 = default_vertex_shader_source_abi_cxx11_;
      puVar5 = (undefined1 *)&local_2a0;
      break;
    case VERTEX_SHADER_TYPE:
      puVar7 = (undefined1 *)&local_2a0;
      goto LAB_00b3b47a;
    case COMPUTE_SHADER_TYPE:
      break;
    case GEOMETRY_SHADER_TYPE:
    case TESSELATION_CONTROL_SHADER_TYPE:
    case TESSELATION_EVALUATION_SHADER_TYPE:
      puVar7 = default_vertex_shader_source_abi_cxx11_;
LAB_00b3b47a:
      puVar5 = default_fragment_shader_source_abi_cxx11_;
      break;
    default:
      pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar3,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x84a);
      __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (*(local_220->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.
      super_TestNode._vptr_TestNode[9])(local_220,puVar7,puVar5,1,0);
    if (local_2a0 != &local_290) {
      operator_delete(local_2a0,local_290 + 1);
    }
    lVar6 = lVar6 + 0x20;
    if (lVar6 == 0x1e8) {
      lVar6 = -0x1e0;
      do {
        if (plVar8 != (long *)plVar8[-2]) {
          operator_delete((long *)plVar8[-2],*plVar8 + 1);
        }
        plVar8 = plVar8 + -4;
        lVar6 = lVar6 + 0x20;
      } while (lVar6 != 0);
      if (local_280[0] != local_270) {
        operator_delete(local_280[0],local_270[0] + 1);
      }
      return;
    }
  } while( true );
}

Assistant:

void ConstructorsAndUnsizedDeclUnsizedConstructors<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string shader_variable_declarations = "= float[2][1][2][1](\n"
											   "        float[1][2][1](\n"
											   "            float[2][1]( \n"
											   "                float[1](12.3), float[1](54.2) \n"
											   "            )\n"
											   "        ),\n"
											   "        float[1][2][1](\n"
											   "            float[2][1]( \n"
											   "                float[1]( 3.2), float[1]( 7.4) \n"
											   "            )\n"
											   "        )\n"
											   "    );\n\n";

	std::string input[] = { "float a[2][1][2][]", "float a[2][1][][1]", "float a[2][1][][]", "float a[2][][2][1]",
							"float a[2][][2][]",  "float a[2][][][1]",  "float a[2][][][]",  "float a[][1][2][1]",
							"float a[][1][2][]",  "float a[][1][][1]",  "float a[][1][][]",  "float a[][][2][1]",
							"float a[][][2][]",   "float a[][][][1]",   "float a[][][][]" };

	for (size_t string_index = 0; string_index < sizeof(input) / sizeof(input[0]); string_index++)
	{
		std::string shader_source = shader_start + "    " + input[string_index] + shader_variable_declarations;

		/* End main */
		DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

		/* Execute test */
		EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
	} /* for (int string_index = 0; ...) */
}